

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O3

void msa_sld_df(uint32_t df,wr_t *pwd,wr_t *pws,target_ulong rt)

{
  bool bVar1;
  bool bVar2;
  wr_t *pwVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  uint8_t v [64];
  undefined8 local_48;
  int64_t iStack_40;
  int64_t local_38;
  int64_t iStack_30;
  
  if (3 < df) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                  ,0x1276,"void msa_sld_df(uint32_t, wr_t *, wr_t *, target_ulong)");
  }
  uVar7 = (0x80UL >> ((char)df + 3U & 0x3f)) + 0xffffffff & rt;
  iVar6 = (int)uVar7;
  switch(df) {
  case 0:
    local_48 = pws->d[0];
    iStack_40 = pws->d[1];
    local_38 = pwd->d[0];
    iStack_30 = pwd->d[1];
    lVar4 = 0;
    do {
      pwd->b[lVar4] = *(int8_t *)((long)&local_48 + (ulong)(uint)(iVar6 + (int)lVar4));
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x10);
    break;
  case 1:
    lVar4 = 0;
    bVar1 = true;
    do {
      bVar2 = bVar1;
      local_48 = *(undefined8 *)((long)pws + lVar4);
      iStack_40 = *(undefined8 *)((long)pwd + lVar4);
      lVar5 = 0;
      do {
        pwd->b[lVar5 + lVar4] = *(int8_t *)((long)&local_48 + (ulong)(uint)(iVar6 + (int)lVar5));
        lVar5 = lVar5 + 1;
      } while (lVar5 != 8);
      lVar4 = 8;
      bVar1 = false;
    } while (bVar2);
    break;
  case 2:
    lVar4 = 0;
    pwVar3 = pwd;
    do {
      local_48 = CONCAT44(pwd->w[lVar4],pws->w[lVar4]);
      lVar5 = 0;
      do {
        pwVar3->b[lVar5] = *(int8_t *)((long)&local_48 + (ulong)(uint)(iVar6 + (int)lVar5));
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
      lVar4 = lVar4 + 1;
      pwVar3 = (wr_t *)(pwVar3->b + 4);
    } while (lVar4 != 4);
    break;
  case 3:
    lVar4 = 0;
    do {
      local_48._0_4_ = CONCAT22(pwd->h[lVar4],pws->h[lVar4]);
      *(undefined1 *)((long)pwd + lVar4 * 2) =
           *(undefined1 *)((long)&local_48 + (uVar7 & 0xffffffff));
      pwd->b[lVar4 * 2 + 1] = *(int8_t *)((long)&local_48 + (ulong)(iVar6 + 1));
      lVar4 = lVar4 + 1;
    } while (lVar4 != 8);
  }
  return;
}

Assistant:

static inline void msa_sld_df(uint32_t df, wr_t *pwd,
                              wr_t *pws, target_ulong rt)
{
    uint32_t n = rt % DF_ELEMENTS(df);
    uint8_t v[64];
    uint32_t i, k;

    switch (df) {
    case DF_BYTE:
        CONCATENATE_AND_SLIDE(DF_ELEMENTS(DF_BYTE), 0);
        break;
    case DF_HALF:
        for (k = 0; k < 2; k++) {
            CONCATENATE_AND_SLIDE(DF_ELEMENTS(DF_HALF), k);
        }
        break;
    case DF_WORD:
        for (k = 0; k < 4; k++) {
            CONCATENATE_AND_SLIDE(DF_ELEMENTS(DF_WORD), k);
        }
        break;
    case DF_DOUBLE:
        for (k = 0; k < 8; k++) {
            CONCATENATE_AND_SLIDE(DF_ELEMENTS(DF_DOUBLE), k);
        }
        break;
    default:
        assert(0);
    }
}